

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BronKerbosch.cpp
# Opt level: O0

void __thiscall BronKerbosch::printSet(BronKerbosch *this,ostream *os,alignment_set_t *set)

{
  ostream *this_00;
  ostream *in_RSI;
  size_type unaff_retaddr;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000008;
  size_type j;
  ulong local_20;
  
  local_20 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                       ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x25780a);
  while (local_20 != 0xffffffffffffffff) {
    this_00 = std::operator<<(in_RSI," ");
    std::ostream::operator<<(this_00,local_20);
    local_20 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                         (in_stack_00000008,unaff_retaddr);
  }
  std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void BronKerbosch::printSet(std::ostream& os, alignment_set_t set) {
    for (auto j = set.find_first(); j != alignment_set_t::npos; j = set.find_next(j)) {
        os << " " << j;
    }
    os << endl;
}